

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O2

pair<unsigned_long,_std::tuple<std::vector<int,_std::allocator<int>_>_>_> * __thiscall
cppqc::detail::
doShrink<std::vector<int,std::allocator<int>>,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
          (pair<unsigned_long,_std::tuple<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,detail *this,
          Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
          *prop,Input *in,duration<double,_std::ratio<1L,_1L>_> timeout,ostream *out)

{
  bool bVar1;
  pointer ptVar2;
  bool bVar3;
  char cVar4;
  pointer __x;
  Input shrunk;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
  shrinks;
  anon_class_16_2_431eb4e8 isTimeoutReached;
  Input input;
  unsigned_long local_a0;
  _Vector_base<int,_std::allocator<int>_> local_88;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
  local_70;
  anon_class_16_2_431eb4e8 local_58;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_88,
             (vector<int,_std::allocator<int>_> *)prop);
  local_58.start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_a0 = 0;
  local_58.timeout.__r = timeout.__r;
  do {
    (**(code **)(**(long **)(this + 8) + 0x18))(&local_70,*(long **)(this + 8),&local_88);
    ptVar2 = local_70.
             super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __x = local_70.
          super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (__x == ptVar2) {
        bVar3 = true;
        break;
      }
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_48,
                 (vector<int,_std::allocator<int>_> *)__x);
      bVar3 = doShrink<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
              ::anon_class_16_2_431eb4e8::operator()(&local_58);
      if (bVar3) {
        std::operator<<((ostream *)in,"Shrinking timed out...\n");
        bVar3 = true;
LAB_0010b992:
        bVar1 = false;
      }
      else {
        cVar4 = (**(code **)(*(long *)this + 0x30))(this,&local_48);
        bVar3 = true;
        if (cVar4 == '\0') {
          std::vector<int,_std::allocator<int>_>::_M_move_assign
                    ((vector<int,_std::allocator<int>_> *)&local_88,&local_48);
          local_a0 = local_a0 + 1;
          bVar3 = false;
          goto LAB_0010b992;
        }
        bVar1 = true;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
      __x = __x + 1;
    } while (bVar1);
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector(&local_70);
    if (bVar3) {
      __return_storage_ptr__->first = local_a0;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&__return_storage_ptr__->second,
                 (vector<int,_std::allocator<int>_> *)&local_88);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<std::size_t, typename Property<T0, T1, T2, T3, T4>::Input> doShrink(
    const Property<T0, T1, T2, T3, T4>& prop,
    const typename Property<T0, T1, T2, T3, T4>::Input& in,
    std::chrono::duration<double> timeout,
    std::ostream& out = std::cout) {
  using Input = typename Property<T0, T1, T2, T3, T4>::Input;

  std::size_t numShrinks = 0;
  Input shrunk = in;
  const auto start = std::chrono::steady_clock::now();

  auto isTimeoutReached = [start, timeout]() {
    const std::chrono::duration<double> elapsed =
        std::chrono::steady_clock::now() - start;
    return elapsed >= timeout;
  };

  try {
  continueShrinking:
    std::vector<Input> shrinks = prop.shrinkInput(shrunk);
    for (Input input : shrinks) {
      if (isTimeoutReached()) {
        out << "Shrinking timed out...\n";
        break;
      }

      if (!prop.checkInput(input)) {
        shrunk = std::move(input);
        numShrinks++;
        goto continueShrinking;
      }
    }
  } catch (...) {
  }
  return std::make_pair(numShrinks, shrunk);
}